

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

quad<unsigned_char> __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
           *this,quad<unsigned_char> x,quad<unsigned_char> ra,quad<unsigned_char> rb)

{
  int32_t iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  reference pvVar6;
  undefined4 in_register_0000000c;
  uchar *puVar7;
  undefined4 in_register_00000014;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  size_t *siglen_03;
  size_t *siglen_04;
  size_t *siglen_05;
  undefined4 in_register_00000034;
  uchar *puVar8;
  uint uVar9;
  array<charls::context_run_mode,_2UL> *this_00;
  size_t in_R8;
  triplet<unsigned_char> local_38;
  triplet<unsigned_char> local_33;
  int32_t local_30;
  int32_t local_2c;
  int32_t error_value4;
  int32_t error_value3;
  int32_t error_value2;
  int32_t error_value1;
  jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
  *this_local;
  quad<unsigned_char> rb_local;
  quad<unsigned_char> ra_local;
  quad<unsigned_char> x_local;
  
  _error_value2 = this;
  this_local._0_4_ = rb;
  this_local._4_4_ = ra;
  rb_local = x;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(((uint)rb & 0xff) - ((uint)ra & 0xff)),
                       (uchar *)CONCAT44(in_register_00000034,x),
                       (size_t *)CONCAT44(in_register_00000014,ra),
                       (uchar *)CONCAT44(in_register_0000000c,rb),in_R8);
  puVar7 = (uchar *)(ulong)this_local._0_1_;
  error_value3 = lossless_traits_impl<unsigned_char,_8>::compute_error_value
                           (iVar5 * (((uint)rb_local & 0xff) - ((uint)this_local._0_4_ & 0xff)));
  this_00 = &this->context_run_mode_;
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  encode_run_interruption_error(this,pvVar6,error_value3);
  iVar5 = charls::sign((EVP_PKEY_CTX *)
                       (ulong)(((uint)this_local._0_4_ >> 8 & 0xff) -
                              ((uint)this_local._4_4_ >> 8 & 0xff)),(uchar *)pvVar6,siglen,puVar7,
                       in_R8);
  puVar7 = (uchar *)(ulong)this_local._1_1_;
  error_value4 = lossless_traits_impl<unsigned_char,_8>::compute_error_value
                           (iVar5 * (((uint)rb_local >> 8 & 0xff) - (uint)this_local._1_1_));
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  encode_run_interruption_error(this,pvVar6,error_value4);
  iVar5 = charls::sign((EVP_PKEY_CTX *)
                       (ulong)(((uint)this_local._0_4_ >> 0x10 & 0xff) -
                              ((uint)this_local._4_4_ >> 0x10 & 0xff)),(uchar *)pvVar6,siglen_00,
                       puVar7,in_R8);
  puVar7 = (uchar *)(ulong)this_local._2_1_;
  local_2c = lossless_traits_impl<unsigned_char,_8>::compute_error_value
                       (iVar5 * (((uint)rb_local >> 0x10 & 0xff) - (uint)this_local._2_1_));
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  encode_run_interruption_error(this,pvVar6,local_2c);
  iVar5 = charls::sign((EVP_PKEY_CTX *)
                       (ulong)(((uint)this_local._0_4_ >> 0x18) - ((uint)this_local._4_4_ >> 0x18)),
                       (uchar *)pvVar6,siglen_01,puVar7,in_R8);
  puVar7 = (uchar *)(ulong)this_local._3_1_;
  local_30 = lossless_traits_impl<unsigned_char,_8>::compute_error_value
                       (iVar5 * (((uint)rb_local >> 0x18) - (uint)this_local._3_1_));
  pvVar6 = std::array<charls::context_run_mode,_2UL>::operator[](this_00,0);
  encode_run_interruption_error(this,pvVar6,local_30);
  iVar1 = error_value3;
  uVar9 = (uint)this_local._0_4_ & 0xff;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar9 - ((uint)this_local._4_4_ & 0xff)),
                       (uchar *)pvVar6,siglen_02,puVar7,in_R8);
  puVar8 = (uchar *)(ulong)(uint)(iVar1 * iVar5);
  bVar2 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample
                    (uVar9,iVar1 * iVar5);
  iVar1 = error_value4;
  uVar9 = (uint)this_local._0_4_ >> 8 & 0xff;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar9 - ((uint)this_local._4_4_ >> 8 & 0xff)),puVar8,
                       siglen_03,puVar7,in_R8);
  puVar8 = (uchar *)(ulong)(uint)(iVar1 * iVar5);
  bVar3 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample
                    (uVar9,iVar1 * iVar5);
  iVar1 = local_2c;
  uVar9 = (uint)this_local._0_4_ >> 0x10 & 0xff;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar9 - ((uint)this_local._4_4_ >> 0x10 & 0xff)),
                       puVar8,siglen_04,puVar7,in_R8);
  bVar4 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample
                    (uVar9,iVar1 * iVar5);
  puVar8 = (uchar *)(ulong)(uint)bVar2;
  puVar7 = (uchar *)(ulong)bVar4;
  triplet<unsigned_char>::triplet(&local_33,(uint)bVar2,(uint)bVar3,(uint)bVar4);
  iVar1 = local_30;
  uVar9 = (uint)this_local._0_4_ >> 0x18;
  iVar5 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar9 - ((uint)this_local._4_4_ >> 0x18)),puVar8,
                       siglen_05,puVar7,in_R8);
  bVar2 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample
                    (uVar9,iVar1 * iVar5);
  local_38.field_2.v3 = local_33.field_2.v3;
  local_38.field_0 = local_33.field_0;
  local_38.field_1 = local_33.field_1;
  quad<unsigned_char>::quad(&ra_local,local_38,(uint)bVar2);
  return ra_local;
}

Assistant:

quad<sample_type> encode_run_interruption_pixel(const quad<sample_type> x, const quad<sample_type> ra,
                                                    const quad<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        const int32_t error_value4{traits_.compute_error_value(sign(rb.v4 - ra.v4) * (x.v4 - rb.v4))};
        encode_run_interruption_error(context_run_mode_[0], error_value4);

        return quad<sample_type>(
            triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                 traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                 traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3))),
            traits_.compute_reconstructed_sample(rb.v4, error_value4 * sign(rb.v4 - ra.v4)));
    }